

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

double maths::Matrix::dotProduct(Matrix *a,Matrix *b)

{
  long lVar1;
  double dVar2;
  
  if (0 < (long)a->rows_) {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + *a->p[lVar1] * *b->p[lVar1];
      lVar1 = lVar1 + 1;
    } while (a->rows_ != lVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

double Matrix::dotProduct(Matrix a, Matrix b)
{
    double sum = 0;
    for (int i = 0; i < a.rows_; ++i) {
        sum += (a(i, 0) * b(i, 0));
    }
    return sum;
}